

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O1

int cdef_find_dir_avx2(uint16_t *img,int stride,int32_t *var,int coeff_shift)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ushort uVar5;
  long lVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  v128 tmp;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  v128 tmp_1;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int32_t cost [8];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 auStack_88 [8];
  v128 lines [8];
  
  lVar6 = 0;
  auVar13._8_2_ = 0xff80;
  auVar13._0_8_ = 0xff80ff80ff80ff80;
  auVar13._10_2_ = 0xff80;
  auVar13._12_2_ = 0xff80;
  auVar13._14_2_ = 0xff80;
  do {
    auVar8 = vlddqu_avx(*(undefined1 (*) [16])img);
    auVar8 = vpsraw_avx(auVar8,ZEXT416((uint)coeff_shift));
    auVar8 = vpaddw_avx(auVar8,auVar13);
    *(undefined1 (*) [16])(local_f8 + lVar6) = auVar8;
    img = (uint16_t *)(*(undefined1 (*) [16])img + (long)stride * 2);
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x80);
  auVar13 = vpslldq_avx(local_f8,0xe);
  auVar8 = vpsrldq_avx(local_f8,2);
  auVar14 = vpslldq_avx(local_e8,0xc);
  auVar13 = vpaddw_avx(auVar14,auVar13);
  auVar14 = vpsrldq_avx(local_e8,4);
  auVar8 = vpaddw_avx(auVar14,auVar8);
  auVar14 = vpaddw_avx(local_e8,local_f8);
  auVar9 = vpslldq_avx(local_d8,10);
  auVar11 = vpsrldq_avx(local_d8,6);
  auVar15 = vpslldq_avx(local_c8,8);
  auVar9 = vpaddw_avx(auVar9,auVar15);
  auVar13 = vpaddw_avx(auVar13,auVar9);
  auVar9 = vpsrldq_avx(local_c8,8);
  auVar9 = vpaddw_avx(auVar11,auVar9);
  auVar8 = vpaddw_avx(auVar8,auVar9);
  auVar9 = vpaddw_avx(local_c8,local_d8);
  auVar11 = vpslldq_avx(auVar14,10);
  auVar15 = vpslldq_avx(auVar9,8);
  auVar11 = vpaddw_avx(auVar15,auVar11);
  auVar15 = vpslldq_avx(auVar14,4);
  auVar12 = vpslldq_avx(auVar9,6);
  auVar15 = vpaddw_avx(auVar12,auVar15);
  auVar12 = vpslldq_avx(local_b8,6);
  auVar10 = vpsrldq_avx(local_b8,10);
  auVar16 = vpslldq_avx(local_a8,4);
  auVar12 = vpaddw_avx(auVar16,auVar12);
  auVar16 = vpsrldq_avx(local_a8,0xc);
  auVar10 = vpaddw_avx(auVar10,auVar16);
  auVar16 = vpsrldq_avx(local_98,0xe);
  auVar10 = vpaddw_avx(auVar16,auVar10);
  auVar16 = vpaddw_avx(local_a8,local_b8);
  auVar8 = vpaddw_avx(auVar10,auVar8);
  auVar12 = vpaddw_avx(_auStack_88,auVar12);
  auVar13 = vpaddw_avx(auVar13,auVar12);
  auVar10 = vpslldq_avx(auVar16,6);
  auVar12 = vpslldq_avx(local_98,2);
  auVar13 = vpaddw_avx(auVar13,auVar12);
  auVar12 = vpaddw_avx(local_98,_auStack_88);
  auVar18 = vpslldq_avx(auVar12,4);
  auVar10 = vpaddw_avx(auVar18,auVar10);
  auVar11 = vpaddw_avx(auVar11,auVar10);
  auVar10 = vpslldq_avx(auVar16,8);
  auVar18 = vpslldq_avx(auVar12,10);
  auVar10 = vpaddw_avx(auVar18,auVar10);
  auVar15 = vpaddw_avx(auVar15,auVar10);
  auVar10 = vpaddw_avx(auVar9,auVar14);
  auVar18 = vpaddw_avx(auVar16,auVar12);
  auVar10 = vpaddw_avx(auVar18,auVar10);
  auVar8 = vpshufb_avx(auVar8,_DAT_005702f0);
  auVar18 = vpunpcklwd_avx(auVar13,auVar8);
  auVar8 = vpunpckhwd_avx(auVar13,auVar8);
  auVar13 = vpmaddwd_avx(auVar18,auVar18);
  auVar8 = vpmaddwd_avx(auVar8,auVar8);
  auVar13 = vpmulld_avx(auVar13,_DAT_00570300);
  auVar8 = vpmulld_avx(auVar8,_DAT_00570310);
  auVar18 = vpaddd_avx(auVar8,auVar13);
  auVar13 = vpblendd_avx2((undefined1  [16])0x0,auVar14,8);
  auVar8 = vpshufhw_avx(auVar13,0x6c);
  auVar13 = vpblendw_avx((undefined1  [16])0x0,auVar9,0xe0);
  auVar13 = vpshufhw_avx(auVar13,0x1b);
  auVar13 = vpaddw_avx(auVar13,auVar8);
  auVar8 = vpshufb_avx(auVar16,_DAT_00570320);
  auVar2 = vpshufb_avx(auVar12,_DAT_00570330);
  auVar8 = vpaddw_avx(auVar8,auVar2);
  auVar13 = vpaddw_avx(auVar8,auVar13);
  auVar2 = vpunpcklwd_avx(auVar15,auVar13);
  auVar8 = vpunpckhwd_avx(auVar15,auVar13);
  auVar13 = vpmaddwd_avx(auVar2,auVar2);
  auVar8 = vpmaddwd_avx(auVar8,auVar8);
  auVar15 = vpmovsxwd_avx(ZEXT816(0xd201a400000000));
  auVar13 = vpmulld_avx(auVar13,auVar15);
  auVar2 = vpmovzxbd_avx(ZEXT416(0x6969698c));
  auVar8 = vpmulld_avx(auVar8,auVar2);
  auVar8 = vpaddd_avx(auVar13,auVar8);
  auVar13 = vpshufb_avx(auVar14,_DAT_00570330);
  auVar14 = vpshufb_avx(auVar9,_DAT_00570320);
  auVar13 = vpaddw_avx(auVar14,auVar13);
  auVar14 = vpblendw_avx((undefined1  [16])0x0,auVar16,0xe0);
  auVar14 = vpshufhw_avx(auVar14,0x1b);
  auVar13 = vpaddw_avx(auVar13,auVar14);
  auVar14 = vpblendd_avx2((undefined1  [16])0x0,auVar12,8);
  auVar14 = vpshufhw_avx(auVar14,0x6c);
  auVar13 = vpaddw_avx(auVar13,auVar14);
  auVar9 = vpunpcklwd_avx(auVar11,auVar13);
  auVar14 = vpunpckhwd_avx(auVar11,auVar13);
  auVar13 = vpmaddwd_avx(auVar9,auVar9);
  auVar14 = vpmaddwd_avx(auVar14,auVar14);
  auVar13 = vpmulld_avx(auVar13,auVar15);
  auVar14 = vpmulld_avx(auVar14,auVar2);
  auVar13 = vpaddd_avx(auVar14,auVar13);
  auVar9 = vpunpckldq_avx(auVar18,auVar13);
  auVar14 = vpunpckhdq_avx(auVar18,auVar13);
  auVar13 = vpmaddwd_avx(auVar10,auVar10);
  auVar17._8_4_ = 0x69;
  auVar17._0_8_ = 0x6900000069;
  auVar17._12_4_ = 0x69;
  auVar13 = vpmulld_avx(auVar13,auVar17);
  auVar11 = vpunpckldq_avx(auVar13,auVar8);
  auVar8 = vpunpckhdq_avx(auVar13,auVar8);
  auVar15 = vpunpcklqdq_avx(auVar9,auVar11);
  auVar13 = vpunpckhqdq_avx(auVar9,auVar11);
  auVar13 = vpaddd_avx(auVar15,auVar13);
  auVar9 = vpunpcklqdq_avx(auVar14,auVar8);
  auVar8 = vpunpckhqdq_avx(auVar14,auVar8);
  auVar8 = vpaddd_avx(auVar8,auVar9);
  auVar2 = vpaddd_avx(auVar13,auVar8);
  auVar11 = vpunpcklwd_avx(local_f8,local_e8);
  auVar13 = vpunpckhwd_avx(local_f8,local_e8);
  auVar15 = vpunpcklwd_avx(local_d8,local_c8);
  auVar8 = vpunpckhwd_avx(local_d8,local_c8);
  auVar12 = vpunpcklwd_avx(local_b8,local_a8);
  auVar14 = vpunpckhwd_avx(local_b8,local_a8);
  auVar10 = vpunpcklwd_avx(local_98,_auStack_88);
  auVar9 = vpunpckhwd_avx(local_98,_auStack_88);
  auVar16 = vpunpckldq_avx(auVar11,auVar15);
  auVar11 = vpunpckhdq_avx(auVar11,auVar15);
  auVar18 = vpunpckldq_avx(auVar12,auVar10);
  auVar15 = vpunpckhdq_avx(auVar12,auVar10);
  auVar12 = vpunpckldq_avx(auVar13,auVar8);
  auVar13 = vpunpckhdq_avx(auVar13,auVar8);
  auVar10 = vpunpckldq_avx(auVar14,auVar9);
  auVar8 = vpunpckhdq_avx(auVar14,auVar9);
  auVar3 = vpunpcklqdq_avx(auVar16,auVar18);
  auVar16 = vpunpckhqdq_avx(auVar16,auVar18);
  auVar4 = vpunpcklqdq_avx(auVar11,auVar15);
  auVar18 = vpunpckhqdq_avx(auVar11,auVar15);
  auVar19 = vpunpcklqdq_avx(auVar12,auVar10);
  auVar11 = vpunpckhqdq_avx(auVar12,auVar10);
  auVar14 = vpunpcklqdq_avx(auVar13,auVar8);
  auVar8 = vpunpckhqdq_avx(auVar13,auVar8);
  auVar10 = vpslldq_avx(auVar8,0xe);
  auVar15 = vpsrldq_avx(auVar8,2);
  auVar9 = vpslldq_avx(auVar13,0xc);
  auVar12 = vpsrldq_avx(auVar14,4);
  auVar13 = vpaddw_avx(auVar14,auVar8);
  auVar8 = vpaddw_avx(auVar12,auVar15);
  auVar14 = vpslldq_avx(auVar11,10);
  auVar14 = vpaddw_avx(auVar9,auVar14);
  auVar14 = vpaddw_avx(auVar14,auVar10);
  auVar9 = vpsrldq_avx(auVar11,6);
  auVar15 = vpsrldq_avx(auVar19,8);
  auVar9 = vpaddw_avx(auVar9,auVar15);
  auVar11 = vpaddw_avx(auVar19,auVar11);
  auVar15 = vpslldq_avx(auVar13,10);
  auVar12 = vpslldq_avx(auVar11,8);
  auVar15 = vpaddw_avx(auVar12,auVar15);
  auVar12 = vpslldq_avx(auVar13,4);
  auVar10 = vpslldq_avx(auVar11,6);
  auVar12 = vpaddw_avx(auVar10,auVar12);
  auVar10 = vpslldq_avx(auVar19,8);
  auVar19 = vpslldq_avx(auVar18,6);
  auVar10 = vpaddw_avx(auVar19,auVar10);
  auVar19 = vpsrldq_avx(auVar18,10);
  auVar9 = vpaddw_avx(auVar9,auVar19);
  auVar19 = vpslldq_avx(auVar4,4);
  auVar10 = vpaddw_avx(auVar19,auVar10);
  auVar19 = vpsrldq_avx(auVar4,0xc);
  auVar9 = vpaddw_avx(auVar9,auVar19);
  auVar19 = vpsrldq_avx(auVar16,0xe);
  auVar9 = vpaddw_avx(auVar9,auVar19);
  auVar8 = vpaddw_avx(auVar9,auVar8);
  auVar19 = vpslldq_avx(auVar16,2);
  auVar9 = vpaddw_avx(auVar3,auVar10);
  auVar9 = vpaddw_avx(auVar9,auVar19);
  auVar10 = vpaddw_avx(auVar4,auVar18);
  auVar14 = vpaddw_avx(auVar14,auVar9);
  auVar9 = vpaddw_avx(auVar3,auVar16);
  auVar16 = vpslldq_avx(auVar10,6);
  auVar18 = vpslldq_avx(auVar9,4);
  auVar16 = vpaddw_avx(auVar18,auVar16);
  auVar15 = vpaddw_avx(auVar15,auVar16);
  auVar16 = vpslldq_avx(auVar10,8);
  auVar18 = vpslldq_avx(auVar9,10);
  auVar16 = vpaddw_avx(auVar18,auVar16);
  auVar12 = vpaddw_avx(auVar12,auVar16);
  auVar16 = vpaddw_avx(auVar11,auVar13);
  auVar18 = vpaddw_avx(auVar10,auVar9);
  auVar16 = vpaddw_avx(auVar16,auVar18);
  auVar8 = vpshufb_avx(auVar8,_DAT_005702f0);
  auVar3 = vpunpcklwd_avx(auVar14,auVar8);
  auVar18 = vpunpckhwd_avx(auVar14,auVar8);
  auVar8 = vpmaddwd_avx(auVar3,auVar3);
  auVar14 = vpmulld_avx(auVar8,_DAT_00570300);
  auVar8 = vpmaddwd_avx(auVar18,auVar18);
  auVar8 = vpmulld_avx(auVar8,_DAT_00570310);
  auVar18 = vpaddd_avx(auVar14,auVar8);
  auVar8 = vpblendw_avx((undefined1  [16])0x0,auVar11,0xe0);
  auVar8 = vpshufhw_avx(auVar8,0x1b);
  auVar14 = vpblendd_avx2((undefined1  [16])0x0,auVar13,8);
  auVar14 = vpshufhw_avx(auVar14,0x6c);
  auVar8 = vpaddw_avx(auVar8,auVar14);
  auVar14 = vpshufb_avx(auVar10,_DAT_00570320);
  auVar3 = vpshufb_avx(auVar9,_DAT_00570330);
  auVar14 = vpaddw_avx(auVar14,auVar3);
  auVar8 = vpaddw_avx(auVar8,auVar14);
  auVar3 = vpunpcklwd_avx(auVar12,auVar8);
  auVar14 = vpunpckhwd_avx(auVar12,auVar8);
  auVar8 = vpmaddwd_avx(auVar3,auVar3);
  auVar14 = vpmaddwd_avx(auVar14,auVar14);
  auVar12 = vpmovsxwd_avx(ZEXT816(0xd201a400000000));
  auVar8 = vpmulld_avx(auVar8,auVar12);
  auVar3 = vpmovzxbd_avx(ZEXT416(0x6969698c));
  auVar14 = vpmulld_avx(auVar14,auVar3);
  auVar8 = vpaddd_avx(auVar14,auVar8);
  auVar14 = vpshufb_avx(auVar11,_DAT_00570320);
  auVar13 = vpshufb_avx(auVar13,_DAT_00570330);
  auVar13 = vpaddw_avx(auVar14,auVar13);
  auVar14 = vpblendw_avx((undefined1  [16])0x0,auVar10,0xe0);
  auVar14 = vpshufhw_avx(auVar14,0x1b);
  auVar13 = vpaddw_avx(auVar13,auVar14);
  auVar14 = vpblendd_avx2((undefined1  [16])0x0,auVar9,8);
  auVar14 = vpshufhw_avx(auVar14,0x6c);
  auVar13 = vpaddw_avx(auVar13,auVar14);
  auVar14 = vpunpcklwd_avx(auVar15,auVar13);
  auVar9 = vpunpckhwd_avx(auVar15,auVar13);
  auVar13 = vpmaddwd_avx(auVar14,auVar14);
  auVar14 = vpmulld_avx(auVar13,auVar12);
  auVar13 = vpmaddwd_avx(auVar9,auVar9);
  auVar13 = vpmulld_avx(auVar13,auVar3);
  auVar13 = vpaddd_avx(auVar13,auVar14);
  auVar14 = vpmaddwd_avx(auVar16,auVar16);
  auVar14 = vpmulld_avx(auVar14,auVar17);
  auVar11 = vpunpckldq_avx(auVar18,auVar13);
  auVar9 = vpunpckhdq_avx(auVar18,auVar13);
  auVar13 = vpunpckldq_avx(auVar14,auVar8);
  auVar8 = vpunpckhdq_avx(auVar14,auVar8);
  auVar14 = vpunpcklqdq_avx(auVar11,auVar13);
  auVar13 = vpunpckhqdq_avx(auVar11,auVar13);
  auVar13 = vpaddd_avx(auVar14,auVar13);
  auVar14 = vpunpcklqdq_avx(auVar9,auVar8);
  auVar8 = vpunpckhqdq_avx(auVar9,auVar8);
  auVar8 = vpaddd_avx(auVar8,auVar14);
  auVar13 = vpaddd_avx(auVar13,auVar8);
  auVar8 = vpmaxsd_avx(auVar13,auVar2);
  auVar14 = vpshufd_avx(auVar8,0x4e);
  auVar8 = vpmaxsd_avx(auVar8,auVar14);
  auVar14 = vpshufd_avx(auVar8,0x39);
  auVar14 = vpmaxsd_avx(auVar8,auVar14);
  lines[6][1] = auVar2._0_8_;
  lines[7][0] = auVar2._8_8_;
  lines[5][1] = auVar13._0_8_;
  lines[6][0] = auVar13._8_8_;
  auVar8 = vpcmpeqd_avx(auVar14,auVar2);
  auVar13 = vpcmpeqd_avx(auVar14,auVar13);
  auVar13 = vpackssdw_avx(auVar13,auVar8);
  auVar13 = vpacksswb_avx(auVar13,auVar13);
  uVar5 = (ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
          (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
          (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
          (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
          (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
          (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
          (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
          (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
          (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
          (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
          (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
          (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
          (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
          (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar13[0xf] >> 7) << 0xf;
  uVar7 = uVar5 - 1 ^ (uint)uVar5;
  uVar1 = 0x1f;
  if (uVar7 != 0) {
    for (; uVar7 >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  *var = auVar14._0_4_ - *(int *)((long)lines[5] + (ulong)(uVar1 & 7 ^ 4) * 4 + 8) >> 10;
  return uVar1;
}

Assistant:

int SIMD_FUNC(cdef_find_dir)(const uint16_t *img, int stride, int32_t *var,
                             int coeff_shift) {
  int i;
  int32_t cost[8];
  int32_t best_cost = 0;
  int best_dir = 0;
  v128 lines[8];
  for (i = 0; i < 8; i++) {
    lines[i] = v128_load_unaligned(&img[i * stride]);
    lines[i] =
        v128_sub_16(v128_shr_s16(lines[i], coeff_shift), v128_dup_16(128));
  }

  /* Compute "mostly vertical" directions. */
  v128 dir47 = compute_directions(lines, cost + 4);

  array_reverse_transpose_8x8(lines, lines);

  /* Compute "mostly horizontal" directions. */
  v128 dir03 = compute_directions(lines, cost);

  v128 max = v128_max_s32(dir03, dir47);
  max = v128_max_s32(max, v128_align(max, max, 8));
  max = v128_max_s32(max, v128_align(max, max, 4));
  best_cost = v128_low_u32(max);
  v128 t =
      v128_pack_s32_s16(v128_cmpeq_32(max, dir47), v128_cmpeq_32(max, dir03));
  best_dir = v128_movemask_8(v128_pack_s16_s8(t, t));
  best_dir = get_msb(best_dir ^ (best_dir - 1));  // Count trailing zeros

  /* Difference between the optimal variance and the variance along the
     orthogonal direction. Again, the sum(x^2) terms cancel out. */
  *var = best_cost - cost[(best_dir + 4) & 7];
  /* We'd normally divide by 840, but dividing by 1024 is close enough
     for what we're going to do with this. */
  *var >>= 10;
  return best_dir;
}